

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O1

void __thiscall miniros::MasterLink::setRetryTimeout(MasterLink *this,WallDuration *timeout)

{
  bool bVar1;
  string local_40;
  
  if (this->internal_ != (Internal *)0x0) {
    local_40._M_dataplus._M_p = (pointer)0x0;
    DurationBase<miniros::WallDuration>::fromSec
              ((DurationBase<miniros::WallDuration> *)&local_40,0.0);
    bVar1 = DurationBase<miniros::WallDuration>::operator<
                      (&timeout->super_DurationBase<miniros::WallDuration>,(WallDuration *)&local_40
                      );
    if (bVar1) {
      if (console::g_initialized == '\0') {
        console::initialize();
      }
      if (setRetryTimeout::loc.initialized_ == false) {
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"miniros.master_link","");
        console::initializeLogLocation(&setRetryTimeout::loc,&local_40,Fatal);
        setRetryTimeout();
      }
      if (setRetryTimeout::loc.level_ != Fatal) {
        setRetryTimeout();
      }
      if (setRetryTimeout::loc.logger_enabled_ == true) {
        setRetryTimeout();
      }
    }
    (this->internal_->retry_timeout).super_DurationBase<miniros::WallDuration> =
         timeout->super_DurationBase<miniros::WallDuration>;
  }
  return;
}

Assistant:

void MasterLink::setRetryTimeout(miniros::WallDuration timeout)
{
  if (!internal_)
    return;
  if (timeout < miniros::WallDuration(0)) {
    MINIROS_FATAL("retry timeout must not be negative.");
    MINIROS_BREAK();
  }
  internal_->retry_timeout = timeout;
}